

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void CPP::writeIconAddFile
               (QTextStream *output,QString *indent,QString *iconName,QString *fileName,char *mode,
               char *state)

{
  QTextStream *pQVar1;
  QString *in_RCX;
  QString *in_RDX;
  QString *in_RSI;
  QTextStream *in_RDI;
  char *in_R8;
  char *in_R9;
  long in_FS_OFFSET;
  _string<true> *in_stack_ffffffffffffff98;
  _string<true> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(in_RDI,in_RSI);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,in_RDX);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,".addFile(");
  language::_string<true>::_string(&local_18,in_RCX,in_RSI);
  pQVar1 = language::operator<<(pQVar1,in_stack_ffffffffffffff98);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,", QSize(), QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"Mode");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,in_R8);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,", QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"State");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,in_R9);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,')');
  QTextStream::operator<<(pQVar1,(QString *)language::eol);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void writeIconAddFile(QTextStream &output, const QString &indent,
                             const QString &iconName, const QString &fileName,
                             const char *mode, const char *state)
{
    output << indent << iconName << ".addFile("
        << language::qstring(fileName, indent) << ", QSize(), QIcon"
        << language::qualifier << "Mode" << language::qualifier << mode
        << ", QIcon" << language::qualifier << "State" << language::qualifier << state
        << ')' << language::eol;
}